

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O2

int xml_parse_data(ly_ctx *ctx,lyxml_elem *xml,lyd_node *parent,lyd_node *first_sibling,
                  lyd_node *prev,int options,unres_data *unres,lyd_node **result,
                  lyd_node **act_notif,char *yang_data_name)

{
  uint8_t *puVar1;
  ushort uVar2;
  LYS_NODE LVar3;
  byte *__s;
  lyd_node *plVar4;
  lyd_node *plVar5;
  lyxml_attr *plVar6;
  lyd_node_leaf_list *leaf;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  lys_node_leaf *plVar11;
  lys_module *plVar12;
  lys_node *plVar13;
  undefined8 *puVar14;
  lyd_node *plVar15;
  lys_node_list *plVar16;
  size_t sVar17;
  char *pcVar18;
  lyd_attr *plVar19;
  lys_type *plVar20;
  hash_table *phVar21;
  byte *pbVar22;
  lyxml_elem *plVar23;
  lyd_attr *plVar24;
  LY_VLOG_ELEM LVar25;
  undefined4 uVar26;
  ulong uVar27;
  undefined8 extraout_RDX;
  lyd_node **pplVar28;
  uint uVar29;
  lyxml_attr **pplVar30;
  LY_ECODE LVar31;
  ly_ctx *plVar32;
  char *pcVar33;
  void *pvVar34;
  undefined8 uVar35;
  lyxml_elem *plVar36;
  lys_node *parent_00;
  lyd_attr **pplVar37;
  size_t sStackY_c0;
  lyd_node *local_80;
  lyd_node *first_sibling_local;
  char *local_70;
  uint local_64;
  lyd_attr *plStack_60;
  int editbits;
  lyd_attr *dattr;
  byte local_49;
  lys_node_leaf *plStack_48;
  uint8_t pos;
  ly_ctx *local_40;
  uint local_34;
  
  local_64 = 0;
  local_80 = first_sibling;
  if (xml == (lyxml_elem *)0x0) {
    pcVar33 = "xml";
    pcVar18 = 
    "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
    ;
    uVar29 = 0x7a;
    goto LAB_0013d1f1;
  }
  if (result == (lyd_node **)0x0) {
    pcVar33 = "result";
    pcVar18 = 
    "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
    ;
    uVar29 = 0x7b;
    goto LAB_0013d1f1;
  }
  *result = (lyd_node *)0x0;
  if ((xml->flags & 1U) != 0) {
    if (((uint)options >> 9 & 1) == 0) {
      return 0;
    }
    pcVar18 = "XML element with mixed content";
    LVar31 = LYE_XML_INVAL;
    LVar25 = LY_VLOG_XML;
    goto LAB_0013c714;
  }
  if ((xml->ns == (lyxml_ns *)0x0) || (pcVar18 = xml->ns->value, pcVar18 == (char *)0x0)) {
    if (((uint)options >> 9 & 1) != 0) {
      ly_vlog(ctx,LYE_XML_MISS,LY_VLOG_XML,xml,"element\'s","namespace");
      return -1;
    }
    return 0;
  }
  local_40 = ctx;
  local_34 = options;
  if (parent == (lyd_node *)0x0) {
    plVar12 = ly_ctx_get_module_by_ns(ctx,pcVar18,(char *)0x0,0);
    if (ctx->data_clb == (ly_module_data_clb)0x0) {
LAB_0013c539:
      if (plVar12 != (lys_module *)0x0) {
        uVar2 = *(ushort *)&plVar12->field_0x40;
        goto LAB_0013c546;
      }
    }
    else {
      if (plVar12 == (lys_module *)0x0) {
        pcVar33 = xml->ns->value;
        pvVar34 = ctx->data_clb_data;
        pcVar18 = (char *)0x0;
        iVar9 = 0;
LAB_0013c534:
        plVar12 = (*ctx->data_clb)(ctx,pcVar18,pcVar33,iVar9,pvVar34);
        goto LAB_0013c539;
      }
      uVar2 = *(ushort *)&plVar12->field_0x40;
      if (-1 < (char)uVar2) {
        pcVar18 = plVar12->name;
        pcVar33 = plVar12->ns;
        pvVar34 = ctx->data_clb_data;
        iVar9 = 1;
        goto LAB_0013c534;
      }
LAB_0013c546:
      if ((uVar2 & 0xc0) == 0x80) {
        if ((local_34 >> 0x18 & 1) == 0) {
          plVar11 = (lys_node_leaf *)xml_data_search_schemanode(xml,plVar12->data,local_34);
          if (plVar11 != (lys_node_leaf *)0x0) goto LAB_0013c635;
          for (plStack_48 = (lys_node_leaf *)0x0; plStack_48 < (ulong)plVar12->augment_size;
              plStack_48 = (lys_node_leaf *)((long)plStack_48 + 1)) {
            plVar13 = plVar12->augment[(long)plStack_48].target;
            if ((plVar13->nodetype & (LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN) {
              parent_00 = (lys_node *)(plVar12->augment + (long)plStack_48);
              for (; plVar13 != (lys_node *)0x0; plVar13 = lys_parent(plVar13)) {
                if ((plVar13->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN)
                goto LAB_0013c5e7;
              }
              plVar11 = (lys_node_leaf *)0x0;
              while (plVar11 = (lys_node_leaf *)
                               lys_getnext((lys_node *)plVar11,parent_00,(lys_module *)0x0,0),
                    plVar11 != (lys_node_leaf *)0x0) {
                if (plVar11->name == xml->name) goto LAB_0013c635;
              }
            }
LAB_0013c5e7:
          }
        }
        else if (yang_data_name != (char *)0x0) {
          sVar17 = strlen(yang_data_name);
          plVar13 = lyp_get_yang_data_template(plVar12,yang_data_name,(int)sVar17);
          if (plVar13 != (lys_node *)0x0) {
            puVar14 = (undefined8 *)
                      lys_ext_complex_get_substmt
                                (LY_STMT_CONTAINER,(lys_ext_instance_complex *)plVar13,
                                 (lyext_substmt **)0x0);
            plVar13 = (lys_node *)*puVar14;
            goto LAB_0013c623;
          }
        }
      }
    }
    plVar11 = (lys_node_leaf *)0x0;
  }
  else {
    plVar11 = (lys_node_leaf *)xml_data_search_schemanode(xml,parent->schema->child,options);
    if (ctx->data_clb != (ly_module_data_clb)0x0) {
      if (plVar11 == (lys_node_leaf *)0x0) {
        plVar12 = (*ctx->data_clb)(ctx,(char *)0x0,xml->ns->value,0,ctx->data_clb_data);
        plVar11 = (lys_node_leaf *)0x0;
        if (plVar12 == (lys_module *)0x0) goto LAB_0013c635;
        plVar13 = parent->schema->child;
LAB_0013c623:
        plVar11 = (lys_node_leaf *)xml_data_search_schemanode(xml,plVar13,local_34);
      }
      else {
        plVar12 = lys_node_module((lys_node *)plVar11);
        if ((plVar12->field_0x40 & 0x80) == 0) {
          plStack_48 = (lys_node_leaf *)ctx->data_clb;
          plVar12 = lys_node_module((lys_node *)plVar11);
          local_70 = plVar12->name;
          plVar12 = lys_node_module((lys_node *)plVar11);
          (*(code *)plStack_48)(ctx,local_70,plVar12->ns,1,ctx->data_clb_data);
        }
      }
    }
  }
LAB_0013c635:
  plStack_48 = plVar11;
  plVar12 = lys_node_module((lys_node *)plVar11);
  if ((plVar12 == (lys_module *)0x0) || ((*(ushort *)&plVar12->field_0x40 & 0xc0) != 0x80)) {
    if ((local_34 >> 9 & 1) == 0) {
      return 0;
    }
    plVar23 = (lyxml_elem *)0x1b2d55;
    if (parent != (lyd_node *)0x0) {
      plVar23 = (lyxml_elem *)parent;
    }
    LVar25 = (parent == (lyd_node *)0x0) + LY_VLOG_LYD;
    pcVar18 = xml->name;
    LVar31 = LYE_INELEM;
    xml = plVar23;
    ctx = local_40;
LAB_0013c714:
    ly_vlog(ctx,LVar31,LVar25,xml,pcVar18);
    return -1;
  }
  LVar3 = plStack_48->nodetype;
  if (LVar3 == LYS_CONTAINER) {
LAB_0013c6b8:
    __s = (byte *)xml->content;
    pbVar22 = __s;
    if (__s != (byte *)0x0) {
      for (; uVar27 = (ulong)*pbVar22, uVar27 < 0x21; pbVar22 = pbVar22 + 1) {
        if ((0x100002600U >> (uVar27 & 0x3f) & 1) == 0) {
          if (uVar27 == 0) goto LAB_0013c73b;
          break;
        }
      }
      sVar17 = strlen((char *)__s);
      pcVar18 = (char *)malloc(sVar17 + 0x17);
      if (pcVar18 != (char *)0x0) {
        sprintf(pcVar18,"node with text data \"%s\"",__s);
        ly_vlog(local_40,LYE_XML_INVAL,LY_VLOG_XML,xml,pcVar18);
        free(pcVar18);
        return -1;
      }
      goto LAB_0013c851;
    }
LAB_0013c73b:
    plVar15 = (lyd_node *)calloc(1,0x48);
    uVar26 = 0;
  }
  else {
    if ((LVar3 != LYS_LEAF) && (LVar3 != LYS_LEAFLIST)) {
      if (LVar3 != LYS_LIST) {
        if (LVar3 == LYS_ANYXML) {
LAB_0013c74a:
          sStackY_c0 = 0x40;
          goto LAB_0013c756;
        }
        if ((LVar3 != LYS_NOTIF) && (LVar3 != LYS_RPC)) {
          if (LVar3 == LYS_ANYDATA) goto LAB_0013c74a;
          if (LVar3 != LYS_ACTION) {
            ly_log(local_40,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                   ,0xfe);
            return -1;
          }
        }
      }
      goto LAB_0013c6b8;
    }
    sStackY_c0 = 0x50;
LAB_0013c756:
    plVar15 = (lyd_node *)calloc(1,sStackY_c0);
    uVar26 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  *result = plVar15;
  if (plVar15 == (lyd_node *)0x0) {
LAB_0013c851:
    ly_log(local_40,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xml_parse_data");
    return -1;
  }
  local_70 = (char *)CONCAT44(local_70._4_4_,uVar26);
  plVar15->prev = plVar15;
  plVar15->schema = (lys_node *)plStack_48;
  plVar15->parent = parent;
  first_sibling_local = (lyd_node *)0x0;
  if ((LVar3 == LYS_LEAF) &&
     (dattr = (lyd_attr *)lys_is_key(plStack_48,&local_49),
     (lys_node_list *)dattr != (lys_node_list *)0x0)) {
    if (parent == (lyd_node *)0x0) {
      __assert_fail("parent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                    ,0x109,
                    "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                   );
    }
    pplVar28 = &parent->child;
    for (uVar29 = 0;
        (plVar15 = *pplVar28, first_sibling_local = plVar15, plVar15 != (lyd_node *)0x0 &&
        (uVar29 < local_49)); uVar29 = uVar29 + 1) {
      if ((((lys_node_leaf *)plVar15->schema)->nodetype != LYS_LEAF) ||
         (plVar16 = lys_is_key((lys_node_leaf *)plVar15->schema,(uint8_t *)0x0),
         plVar16 == (lys_node_list *)0x0)) goto LAB_0013c8a2;
      pplVar28 = &plVar15->next;
    }
    if (plVar15 == (lyd_node *)0x0) goto LAB_0013c91a;
LAB_0013c8a2:
    plVar32 = local_40;
    plVar11 = plStack_48;
    if ((local_34 >> 9 & 1) != 0) {
      ly_vlog(local_40,LYE_INORDER,LY_VLOG_LYD,*result,plStack_48->name,plVar15->schema->name);
      ly_vlog(plVar32,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
              "Invalid position of the key \"%s\" in a list \"%s\".",plVar11->name,
              parent->schema->name);
      free(*result);
      *result = (lyd_node *)0x0;
      return -1;
    }
    ly_log(local_40,LY_LLWRN,LY_SUCCESS,"Invalid position of the key \"%s\" in a list \"%s\".");
    plVar4 = *result;
    if (parent->child == plVar15) {
      parent->child = plVar4;
      first_sibling = plVar4;
      local_80 = plVar4;
    }
    plVar5 = plVar15->prev;
    if (plVar5->next != (lyd_node *)0x0) {
      plVar5->next = plVar4;
    }
    plVar4->prev = plVar5;
    plVar4 = *result;
    plVar15->prev = plVar4;
    plVar4->next = plVar15;
    if (dattr == (lyd_attr *)0x0) goto LAB_0013c923;
  }
  else {
LAB_0013c91a:
    if (parent != (lyd_node *)0x0) {
LAB_0013c923:
      if (parent->child == (lyd_node *)0x0) {
        parent->child = *result;
      }
    }
    plVar15 = *result;
    if (prev == (lyd_node *)0x0) {
      plVar15->prev = plVar15;
      local_80 = plVar15;
    }
    else {
      plVar15->prev = prev;
      plVar15 = *result;
      prev->next = plVar15;
      first_sibling->prev = plVar15;
    }
  }
  iVar9 = ly_new_node_validity((*result)->schema);
  (*result)->validity = (uint8_t)iVar9;
  iVar9 = resolve_applies_when((lys_node *)plStack_48,0,(lys_node *)0x0);
  if (iVar9 != 0) {
    (*result)->field_0x9 = (*result)->field_0x9 & 0xf1 | 8;
  }
  bVar7 = false;
  pplVar30 = &xml->attr;
  while (plVar6 = *pplVar30, plVar6 != (lyxml_attr *)0x0) {
    if (plVar6->type == LYXML_ATTR_STD) {
      if (plVar6->ns == (lyxml_ns *)0x0) {
        if (((*result)->schema->nodetype == LYS_ANYXML) &&
           (iVar9 = ly_strequal_((*result)->schema->name,"filter"), iVar9 != 0)) {
          iVar9 = ly_strequal_((*result)->schema->module->name,"ietf-netconf");
          pcVar18 = "urn:ietf:params:xml:ns:netconf:base:1.0";
          bVar8 = true;
          if (iVar9 == 0) {
            iVar9 = ly_strequal_((*result)->schema->module->name,"notifications");
            pcVar18 = "urn:ietf:params:xml:ns:netconf:base:1.0";
            bVar8 = true;
            if (iVar9 == 0) goto LAB_0013cb15;
          }
          goto LAB_0013c9bc;
        }
      }
      else {
        pcVar18 = plVar6->ns->value;
        bVar8 = bVar7;
LAB_0013c9bc:
        bVar7 = bVar8;
        iVar9 = lyp_fill_attr(local_40,*result,pcVar18,(char *)0x0,plVar6->name,plVar6->value,xml,
                              local_34,&stack0xffffffffffffffa0);
        if (iVar9 != 1) {
          if (iVar9 == -1) goto LAB_0013cffb;
          if ((bVar7) && (iVar9 = strcmp(plVar6->name,"select"), plVar32 = local_40, iVar9 == 0)) {
            pcVar18 = transform_xml2json(local_40,plStack_60->value_str,xml,0,0);
            (plStack_60->value).binary = pcVar18;
            if (pcVar18 == (char *)0x0) {
              plStack_60->value = (lyd_val)plStack_60->value_str;
              goto LAB_0013cffb;
            }
            lydict_remove(plVar32,plStack_60->value_str);
            plStack_60->value_str = (char *)plStack_60->value;
          }
          plVar24 = (*result)->attr;
          if (plVar24 == (lyd_attr *)0x0) {
            (*result)->attr = plStack_60;
          }
          else {
            do {
              plVar19 = plVar24;
              plVar24 = plVar19->next;
            } while (plVar24 != (lyd_attr *)0x0);
            plVar19->next = plStack_60;
          }
          goto LAB_0013cb64;
        }
      }
LAB_0013cb15:
      if ((local_34 >> 9 & 1) != 0) {
        ly_vlog(local_40,LYE_INATTR,LY_VLOG_LYD,*result,plVar6->name);
        goto LAB_0013cffb;
      }
      pcVar18 = "<none>";
      if (plVar6->ns != (lyxml_ns *)0x0) {
        pcVar18 = plVar6->ns->prefix;
      }
      ly_log(local_40,LY_LLWRN,LY_SUCCESS,"Unknown \"%s:%s\" metadata with value \"%s\", ignoring.",
             pcVar18,plVar6->name,plVar6->value);
    }
LAB_0013cb64:
    pplVar30 = &plVar6->next;
  }
  if ((local_34 & 8) == 0) {
    if (!bVar7) {
switchD_0013ce11_caseD_1:
      plVar32 = local_40;
      plVar11 = plStack_48;
      uVar29 = local_64;
      LVar3 = plStack_48->nodetype;
      if ((LVar3 & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        if ((LVar3 & LYS_ANYDATA) == LYS_UNKNOWN) {
          if ((LVar3 & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN) {
            if (LVar3 != LYS_NOTIF) goto LAB_0013d04d;
            if ((local_34 & 0x40) == 0) {
              plVar15 = *result;
            }
            else {
              plVar15 = *result;
              if (*act_notif == (lyd_node *)0x0) {
                *act_notif = plVar15;
                goto LAB_0013d04d;
              }
            }
            ly_vlog(local_40,LYE_INELEM,LY_VLOG_LYD,plVar15,plStack_48->name);
            pcVar18 = plVar11->name;
            pcVar33 = "Unexpected notification node \"%s\".";
          }
          else {
            if ((local_34 & 0x10) == 0) {
              plVar15 = *result;
            }
            else {
              plVar15 = *result;
              if (*act_notif == (lyd_node *)0x0) {
                *act_notif = plVar15;
                goto LAB_0013d04d;
              }
            }
            ly_vlog(local_40,LYE_INELEM,LY_VLOG_LYD,plVar15,plStack_48->name);
            pcVar18 = "action";
            if (plVar11->nodetype == LYS_RPC) {
              pcVar18 = "rpc";
            }
            pcVar33 = "Unexpected %s node \"%s\".";
          }
          LVar31 = LYE_SPEC;
          LVar25 = LY_VLOG_PREV;
          plVar24 = (lyd_attr *)0x0;
          goto LAB_0013cff4;
        }
        plVar23 = xml->child;
        if (plVar23 == (lyxml_elem *)0x0) {
          *(undefined4 *)&(*result)->field_0x34 = 0;
          phVar21 = (hash_table *)lydict_insert(local_40,xml->content,0);
          (*result)->ht = phVar21;
        }
        else {
          xml->child = (lyxml_elem *)0x0;
          for (plVar36 = plVar23; plVar36 != (lyxml_elem *)0x0; plVar36 = plVar36->next) {
            plVar36->parent = (lyxml_elem *)0x0;
            lyxml_correct_elem_ns(local_40,plVar36,1,1);
          }
          plVar15 = *result;
          *(undefined4 *)&plVar15->field_0x34 = 8;
          plVar15->ht = (hash_table *)plVar23;
        }
      }
      else {
        leaf = (lyd_node_leaf_list *)*result;
        if ((leaf == (lyd_node_leaf_list *)0x0) ||
           ((leaf->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)) {
          pcVar33 = "node && (node->schema->nodetype & (LYS_LEAFLIST | LYS_LEAF)) && xml";
          pcVar18 = "int xml_get_value(struct lyd_node *, struct lyxml_elem *, int, int)";
          uVar29 = 0x52;
LAB_0013d1f1:
          __assert_fail(pcVar33,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                        ,uVar29,pcVar18);
        }
        pcVar18 = lydict_insert(leaf->schema->module->ctx,xml->content,0);
        leaf->value_str = pcVar18;
        if ((((uVar29 & 0x20) == 0) || ((leaf->schema->nodetype & LYS_LEAF) == LYS_UNKNOWN)) ||
           ((pcVar18 != (char *)0x0 && (*pcVar18 != '\0')))) {
          plVar20 = lyp_parse_value((lys_type *)&leaf->schema[1].ref,&leaf->value_str,xml,leaf,
                                    (lyd_attr *)0x0,(lys_module *)0x0,1,0,local_34 & 0x2000);
          if (plVar20 == (lys_type *)0x0) goto LAB_0013cffb;
        }
        else {
          leaf->value_type = LY_TYPE_UNKNOWN;
        }
      }
LAB_0013d04d:
      plVar15 = *result;
      if ((plVar15->schema->nodetype != LYS_LIST) || (plVar15->schema->padding[2] == '\0')) {
        lyd_hash(plVar15);
        lyd_insert_hash(*result);
        plVar15 = *result;
      }
      iVar9 = lyv_data_context(plVar15,local_34,unres);
      uVar29 = local_34;
      if (iVar9 == 0) {
        if (((char)local_70 == '\0') && (xml->child != (lyxml_elem *)0x0)) {
          first_sibling_local = (lyd_node *)0x0;
          plVar23 = xml->child;
          plVar15 = (lyd_node *)0x0;
          while (plVar23 != (lyxml_elem *)0x0) {
            plVar36 = plVar23->next;
            iVar9 = xml_parse_data(local_40,plVar23,*result,(*result)->child,plVar15,uVar29,unres,
                                   &first_sibling_local,act_notif,yang_data_name);
            if (iVar9 != 0) goto LAB_0013d006;
            if ((uVar29 >> 10 & 1) != 0) {
              lyxml_free(local_40,plVar23);
            }
            plVar23 = plVar36;
            if ((first_sibling_local != (lyd_node *)0x0) &&
               (first_sibling_local->next == (lyd_node *)0x0)) {
              plVar15 = first_sibling_local;
            }
          }
        }
        plVar15 = *result;
        if ((((plStack_48->nodetype == LYS_CONTAINER) && (plVar15->child == (lyd_node *)0x0)) &&
            (plVar15->attr == (lyd_attr *)0x0)) &&
           ((plStack_48->type).ext == (lys_ext_instance **)0x0)) {
          plVar15->field_0x9 = plVar15->field_0x9 | 1;
          plVar15 = *result;
        }
        iVar9 = lyv_data_content(plVar15,local_34,unres);
        if (iVar9 == 0) {
          pplVar28 = &local_80;
          if (prev == (lyd_node *)0x0) {
            pplVar28 = (lyd_node **)0x0;
          }
          iVar9 = lyv_multicases(*result,(lys_node *)0x0,pplVar28,0,(lyd_node *)0x0);
          if (iVar9 == 0) {
            if (((*result)->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
              puVar1 = &(*result)->validity;
              *puVar1 = *puVar1 | 1;
              return 0;
            }
            return 0;
          }
        }
      }
      goto LAB_0013d006;
    }
    dattr = (lyd_attr *)*result;
    pplVar37 = &((lyd_node *)dattr)->attr;
    uVar27 = 0;
    while( true ) {
      plVar24 = *pplVar37;
      uVar29 = (uint)uVar27;
      if (plVar24 == (lyd_attr *)0x0) break;
      pcVar18 = plVar24->name;
      iVar9 = strcmp(pcVar18,"type");
      if (iVar9 == 0) {
        if ((uVar29 < 5) && ((0x16U >> uVar29 & 1) != 0)) {
          ly_vlog(local_40,LYE_TOOMANY,LY_VLOG_LYD,dattr,"type",xml->name);
          goto LAB_0013cffb;
        }
        iVar9 = ((plVar24->value).enm)->value;
        if (iVar9 == 1) {
          if (uVar29 == 0) {
            uVar10 = 2;
          }
          else {
            uVar10 = 4;
            if (uVar29 != 3) {
              __assert_fail("!found",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                            ,0x195,
                            "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                           );
            }
          }
        }
        else {
          if (iVar9 != 0) {
            uVar35 = 0x19a;
            goto LAB_0013cf27;
          }
          uVar10 = 1;
          if (uVar29 != 0) {
            if (uVar29 != 3) {
              __assert_fail("!found",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
                            ,0x18d,
                            "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **, const char *)"
                           );
            }
            ly_vlog(local_40,LYE_INATTR,LY_VLOG_LYD,dattr,pcVar18);
            goto LAB_0013cffb;
          }
        }
      }
      else {
        iVar9 = strcmp(pcVar18,"select");
        uVar10 = uVar29;
        if (iVar9 == 0) {
          iVar9 = (*(code *)((long)&DAT_0019b500 + (long)(int)(&DAT_0019b500)[uVar27]))();
          return iVar9;
        }
      }
      pplVar37 = &plVar24->next;
      uVar27 = (ulong)uVar10;
    }
    switch(uVar29) {
    case 1:
    case 4:
      goto switchD_0013ce11_caseD_1;
    case 2:
      pcVar18 = xml->name;
      pcVar33 = "select";
      break;
    case 3:
      pcVar18 = xml->name;
      pcVar33 = "type";
      break;
    default:
      uVar35 = 0x1c0;
LAB_0013cf27:
      ly_log(local_40,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_xml.c"
             ,uVar35);
      goto LAB_0013cffb;
    }
    LVar31 = LYE_MISSATTR;
    LVar25 = LY_VLOG_LYD;
    plVar24 = dattr;
    plVar32 = local_40;
LAB_0013cff4:
    ly_vlog(plVar32,LVar31,LVar25,plVar24,pcVar33,pcVar18);
  }
  else {
    iVar9 = lyp_check_edit_attr(local_40,(*result)->attr,*result,(int *)&local_64);
    if (iVar9 == 0) goto switchD_0013ce11_caseD_1;
  }
LAB_0013cffb:
  lyd_unlink_internal(*result,2);
LAB_0013d006:
  uVar29 = unres->count;
  while (uVar29 = uVar29 - 1, -1 < (int)uVar29) {
    if (unres->node[uVar29 & 0x7fffffff] == *result) {
      unres_data_del(unres,uVar29);
    }
  }
  lyd_free(*result);
  *result = (lyd_node *)0x0;
  return -1;
}

Assistant:

static int
xml_parse_data(struct ly_ctx *ctx, struct lyxml_elem *xml, struct lyd_node *parent, struct lyd_node *first_sibling,
               struct lyd_node *prev, int options, struct unres_data *unres, struct lyd_node **result,
               struct lyd_node **act_notif, const char *yang_data_name)
{
    const struct lys_module *mod = NULL;
    struct lyd_node *diter, *dlast;
    struct lys_node *schema = NULL, *target;
    const struct lys_node *ext_node;
    struct lys_node_augment *aug;
    struct lyd_attr *dattr, *dattr_iter;
    struct lyxml_attr *attr;
    struct lyxml_elem *child, *next;
    int i, j, havechildren, r, editbits = 0, filterflag = 0, found;
    uint8_t pos;
    int ret = 0;
    const char *str = NULL;
    char *msg;

    assert(xml);
    assert(result);
    *result = NULL;

    if (xml->flags & LYXML_ELEM_MIXED) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_XML, xml, "XML element with mixed content");
            return -1;
        } else {
            return 0;
        }
    }

    if (!xml->ns || !xml->ns->value) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(ctx, LYE_XML_MISS, LY_VLOG_XML, xml, "element's", "namespace");
            return -1;
        } else {
            return 0;
        }
    }

    /* find schema node */
    if (!parent) {
        mod = ly_ctx_get_module_by_ns(ctx, xml->ns->value, NULL, 0);
        if (ctx->data_clb) {
            if (!mod) {
                mod = ctx->data_clb(ctx, NULL, xml->ns->value, 0, ctx->data_clb_data);
            } else if (!mod->implemented) {
                mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
            }
        }

        /* get the proper schema node */
        if (mod && mod->implemented && !mod->disabled) {
            if (options & LYD_OPT_DATA_TEMPLATE) {
                if (yang_data_name) {
                    ext_node = lyp_get_yang_data_template(mod, yang_data_name, strlen(yang_data_name));
                    if (ext_node) {
                        schema = *((struct lys_node **) lys_ext_complex_get_substmt(LY_STMT_CONTAINER, (struct lys_ext_instance_complex *)ext_node, NULL));
                        schema = xml_data_search_schemanode(xml, schema, options);
                    }
                }
            } else {
                schema = xml_data_search_schemanode(xml, mod->data, options);
                if (!schema) {
                    /* it still can be the specific case of this module containing an augment of another module
                    * top-level choice or top-level choice's case, bleh */
                    for (j = 0; j < mod->augment_size; ++j) {
                        aug = &mod->augment[j];
                        target = aug->target;
                        if (target->nodetype & (LYS_CHOICE | LYS_CASE)) {
                            /* 1) okay, the target is choice or case */
                            while (target && (target->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES))) {
                                target = lys_parent(target);
                            }
                            /* 2) now, the data node will be top-level, there are only non-data schema nodes */
                            if (!target) {
                                while ((schema = (struct lys_node *) lys_getnext(schema, (struct lys_node *) aug, NULL, 0))) {
                                    /* 3) alright, even the name matches, we found our schema node */
                                    if (ly_strequal(schema->name, xml->name, 1)) {
                                        break;
                                    }
                                }
                            }
                        }

                        if (schema) {
                            break;
                        }
                    }
                }
            }
        }
    } else {
        /* parsing some internal node, we start with parent's schema pointer */
        schema = xml_data_search_schemanode(xml, parent->schema->child, options);

        if (ctx->data_clb) {
            if (schema && !lys_node_module(schema)->implemented) {
                ctx->data_clb(ctx, lys_node_module(schema)->name, lys_node_module(schema)->ns,
                              LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
            } else if (!schema) {
                if (ctx->data_clb(ctx, NULL, xml->ns->value, 0, ctx->data_clb_data)) {
                    /* context was updated, so try to find the schema node again */
                    schema = xml_data_search_schemanode(xml, parent->schema->child, options);
                }
            }
        }
    }

    mod = lys_node_module(schema);
    if (!mod || !mod->implemented || mod->disabled) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(ctx, LYE_INELEM, (parent ? LY_VLOG_LYD : LY_VLOG_STR), (parent ? (void *)parent : (void *)"/") , xml->name);
            return -1;
        } else {
            return 0;
        }
    }

    /* create the element structure */
    switch (schema->nodetype) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_NOTIF:
    case LYS_RPC:
    case LYS_ACTION:
        for (i = 0; xml->content && xml->content[i]; ++i) {
            if (!is_xmlws(xml->content[i])) {
                msg = malloc(22 + strlen(xml->content) + 1);
                LY_CHECK_ERR_RETURN(!msg, LOGMEM(ctx), -1);
                sprintf(msg, "node with text data \"%s\"", xml->content);
                LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_XML, xml, msg);
                free(msg);
                return -1;
            }
        }
        *result = calloc(1, sizeof **result);
        havechildren = 1;
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
        *result = calloc(1, sizeof(struct lyd_node_leaf_list));
        havechildren = 0;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        *result = calloc(1, sizeof(struct lyd_node_anydata));
        havechildren = 0;
        break;
    default:
        LOGINT(ctx);
        return -1;
    }
    LY_CHECK_ERR_RETURN(!(*result), LOGMEM(ctx), -1);

    (*result)->prev = *result;
    (*result)->schema = schema;
    (*result)->parent = parent;
    diter = NULL;
    if (schema->nodetype == LYS_LEAF && lys_is_key((struct lys_node_leaf *)schema, &pos)) {
        /* it is key and we need to insert it into a correct place (a key must have a parent list) */
        assert(parent);
        for (i = 0, diter = parent->child;
                diter && i < pos && diter->schema->nodetype == LYS_LEAF && lys_is_key((struct lys_node_leaf *)diter->schema, NULL);
                i++, diter = diter->next);
        if (diter) {
            /* out of order insertion - insert list's key to the correct position, before the diter */
            if (options & LYD_OPT_STRICT) {
                LOGVAL(ctx, LYE_INORDER, LY_VLOG_LYD, *result, schema->name, diter->schema->name);
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Invalid position of the key \"%s\" in a list \"%s\".",
                       schema->name, parent->schema->name);
                free(*result);
                *result = NULL;
                return -1;
            } else {
                LOGWRN(ctx, "Invalid position of the key \"%s\" in a list \"%s\".", schema->name, parent->schema->name)
            }
            if (parent->child == diter) {
                parent->child = *result;
                /* update first_sibling */
                first_sibling = *result;
            }
            if (diter->prev->next) {
                diter->prev->next = *result;
            }
            (*result)->prev = diter->prev;
            diter->prev = *result;
            (*result)->next = diter;
        }
    }
    if (!diter) {
        /* simplified (faster) insert as the last node */
        if (parent && !parent->child) {
            parent->child = *result;
        }
        if (prev) {
            (*result)->prev = prev;
            prev->next = *result;

            /* fix the "last" pointer */
            first_sibling->prev = *result;
        } else {
            (*result)->prev = *result;
            first_sibling = *result;
        }
    }
    (*result)->validity = ly_new_node_validity((*result)->schema);
    if (resolve_applies_when(schema, 0, NULL)) {
        (*result)->when_status = LYD_WHEN;
    }

    /* process attributes */
    for (attr = xml->attr; attr; attr = attr->next) {
        if (attr->type != LYXML_ATTR_STD) {
            continue;
        } else if (!attr->ns) {
            if ((*result)->schema->nodetype == LYS_ANYXML &&
                    ly_strequal((*result)->schema->name, "filter", 0) &&
                    (ly_strequal((*result)->schema->module->name, "ietf-netconf", 0) ||
                    ly_strequal((*result)->schema->module->name, "notifications", 0))) {
                /* NETCONF filter's attributes, which we implement as non-standard annotations,
                 * they are unqualified (no namespace), but we know that we have internally defined
                 * them in the ietf-netconf module */
                str = "urn:ietf:params:xml:ns:netconf:base:1.0";
                filterflag = 1;
            } else {
                /* garbage */
                goto attr_error;
            }
        } else {
            str = attr->ns->value;
        }

        r = lyp_fill_attr(ctx, *result, str, NULL, attr->name, attr->value, xml, options, &dattr);
        if (r == -1) {
            goto unlink_node_error;
        } else if (r == 1) {
attr_error:
            if (options & LYD_OPT_STRICT) {
                LOGVAL(ctx, LYE_INATTR, LY_VLOG_LYD, *result, attr->name);
                goto unlink_node_error;
            }

            LOGWRN(ctx, "Unknown \"%s:%s\" metadata with value \"%s\", ignoring.",
                   (attr->ns ? attr->ns->prefix : "<none>"), attr->name, attr->value);
            continue;
        }

        /* special case of xpath in the value, we want to convert it to JSON */
        if (filterflag && !strcmp(attr->name, "select")) {
            dattr->value.string = transform_xml2json(ctx, dattr->value_str, xml, 0, 0);
            if (!dattr->value.string) {
                /* problem with resolving value as xpath */
                dattr->value.string = dattr->value_str;
                goto unlink_node_error;
            }
            lydict_remove(ctx, dattr->value_str);
            dattr->value_str = dattr->value.string;
        }

        /* insert into the data node */
        if (!(*result)->attr) {
            (*result)->attr = dattr;
        } else {
            for (dattr_iter = (*result)->attr; dattr_iter->next; dattr_iter = dattr_iter->next);
            dattr_iter->next = dattr;
        }
        continue;
    }

    /* check insert attribute and its values */
    if (options & LYD_OPT_EDIT) {
        if (lyp_check_edit_attr(ctx, (*result)->attr, *result, &editbits)) {
            goto unlink_node_error;
        }

    /* check correct filter extension attributes */
    } else if (filterflag) {
        found = 0; /* 0 - nothing, 1 - type subtree, 2 - type xpath, 3 - select, 4 - type xpath + select */
        LY_TREE_FOR((*result)->attr, dattr_iter) {
            if (!strcmp(dattr_iter->name, "type")) {
                if ((found == 1) || (found == 2) || (found == 4)) {
                    LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYD, (*result), "type", xml->name);
                    goto unlink_node_error;
                }
                switch (dattr_iter->value.enm->value) {
                case 0:
                    /* subtree */
                    if (found == 3) {
                        LOGVAL(ctx, LYE_INATTR, LY_VLOG_LYD, (*result), dattr_iter->name);
                        goto unlink_node_error;
                    }

                    assert(!found);
                    found = 1;
                    break;
                case 1:
                    /* xpath */
                    if (found == 3) {
                        found = 4;
                    } else {
                        assert(!found);
                        found = 2;
                    }
                    break;
                default:
                    LOGINT(ctx);
                    goto unlink_node_error;
                }
            } else if (!strcmp(dattr_iter->name, "select")) {
                switch (found) {
                case 0:
                    found = 3;
                    break;
                case 1:
                    LOGVAL(ctx, LYE_INATTR, LY_VLOG_LYD, (*result), dattr_iter->name);
                    goto unlink_node_error;
                case 2:
                    found = 4;
                    break;
                case 3:
                case 4:
                    LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYD, (*result), "select", xml->name);
                    goto unlink_node_error;
                default:
                    LOGINT(ctx);
                    goto unlink_node_error;
                }
            }
        }

        /* check if what we found is correct */
        switch (found) {
        case 1:
        case 4:
            /* ok */
            break;
        case 2:
            LOGVAL(ctx, LYE_MISSATTR, LY_VLOG_LYD, (*result), "select", xml->name);
            goto unlink_node_error;
        case 3:
            LOGVAL(ctx, LYE_MISSATTR, LY_VLOG_LYD, (*result), "type", xml->name);
            goto unlink_node_error;
        default:
            LOGINT(ctx);
            goto unlink_node_error;
        }
    }

    /* type specific processing */
    if (schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
        /* type detection and assigning the value */
        if (xml_get_value(*result, xml, editbits, options & LYD_OPT_TRUSTED)) {
            goto unlink_node_error;
        }
    } else if (schema->nodetype & LYS_ANYDATA) {
        /* store children values */
        if (xml->child) {
            child = xml->child;
            /* manually unlink all siblings and correct namespaces */
            xml->child = NULL;
            LY_TREE_FOR(child, next) {
                next->parent = NULL;
                lyxml_correct_elem_ns(ctx, next, 1, 1);
            }

            ((struct lyd_node_anydata *)*result)->value_type = LYD_ANYDATA_XML;
            ((struct lyd_node_anydata *)*result)->value.xml = child;
        } else {
            ((struct lyd_node_anydata *)*result)->value_type = LYD_ANYDATA_CONSTSTRING;
            ((struct lyd_node_anydata *)*result)->value.str = lydict_insert(ctx, xml->content, 0);
        }
    } else if (schema->nodetype & (LYS_RPC | LYS_ACTION)) {
        if (!(options & LYD_OPT_RPC) || *act_notif) {
            LOGVAL(ctx, LYE_INELEM, LY_VLOG_LYD, (*result), schema->name);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Unexpected %s node \"%s\".",
                   (schema->nodetype == LYS_RPC ? "rpc" : "action"), schema->name);
            goto unlink_node_error;
        }
        *act_notif = *result;
    } else if (schema->nodetype == LYS_NOTIF) {
        if (!(options & LYD_OPT_NOTIF) || *act_notif) {
            LOGVAL(ctx, LYE_INELEM, LY_VLOG_LYD, (*result), schema->name);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Unexpected notification node \"%s\".", schema->name);
            goto unlink_node_error;
        }
        *act_notif = *result;
    }

#ifdef LY_ENABLED_CACHE
    /* calculate the hash and insert it into parent (list with keys is handled when its keys are inserted) */
    if (((*result)->schema->nodetype != LYS_LIST) || !((struct lys_node_list *)(*result)->schema)->keys_size) {
        lyd_hash(*result);
        lyd_insert_hash(*result);
    }
#endif

    /* first part of validation checks */
    if (lyv_data_context(*result, options, unres)) {
        goto error;
    }

    /* process children */
    if (havechildren && xml->child) {
        diter = dlast = NULL;
        LY_TREE_FOR_SAFE(xml->child, next, child) {
            r = xml_parse_data(ctx, child, *result, (*result)->child, dlast, options, unres, &diter, act_notif, yang_data_name);
            if (r) {
                goto error;
            } else if (options & LYD_OPT_DESTRUCT) {
                lyxml_free(ctx, child);
            }
            if (diter && !diter->next) {
                /* the child was parsed/created and it was placed as the last child. The child can be inserted
                 * out of order (not as the last one) in case it is a list's key present out of the correct order */
                dlast = diter;
            }
        }
    }

    /* if we have empty non-presence container, we keep it, but mark it as default */
    if (schema->nodetype == LYS_CONTAINER && !(*result)->child &&
            !(*result)->attr && !((struct lys_node_container *)schema)->presence) {
        (*result)->dflt = 1;
    }

    /* rest of validation checks */
    if (lyv_data_content(*result, options, unres) ||
            lyv_multicases(*result, NULL, prev ? &first_sibling : NULL, 0, NULL)) {
        goto error;
    }

    /* validation successful */
    if ((*result)->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) {
        /* postpone checking when there will be all list/leaflist instances */
        (*result)->validity |= LYD_VAL_DUP;
    }

    return ret;

unlink_node_error:
    lyd_unlink_internal(*result, 2);
error:
    /* cleanup */
    for (i = unres->count - 1; i >= 0; i--) {
        /* remove unres items connected with the node being removed */
        if (unres->node[i] == *result) {
            unres_data_del(unres, i);
        }
    }
    lyd_free(*result);
    *result = NULL;
    return -1;
}